

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvector_serial.c
# Opt level: O2

int N_VBufPack_Serial(N_Vector x,void *buf)

{
  uint uVar1;
  long lVar2;
  uint uVar3;
  ulong uVar4;
  
  if (buf == (void *)0x0 || x == (N_Vector)0x0) {
    uVar3 = 0xffffffff;
  }
  else {
    uVar1 = *x->content;
    lVar2 = *(long *)((long)x->content + 8);
    uVar3 = 0;
    if ((int)uVar1 < 1) {
      uVar1 = uVar3;
    }
    for (uVar4 = 0; uVar1 != uVar4; uVar4 = uVar4 + 1) {
      *(undefined8 *)((long)buf + uVar4 * 8) = *(undefined8 *)(lVar2 + uVar4 * 8);
    }
  }
  return uVar3;
}

Assistant:

int N_VBufPack_Serial(N_Vector x, void *buf)
{
  sunindextype i, N;
  realtype     *xd = NULL;
  realtype     *bd = NULL;

  if (x == NULL || buf == NULL) return(-1);

  N  = NV_LENGTH_S(x);
  xd = NV_DATA_S(x);
  bd = (realtype*) buf;

  for (i = 0; i < N; i++)
    bd[i] = xd[i];

  return(0);
}